

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_60(QPDF *pdf,char *arg2)

{
  QPDFWriter local_728 [8];
  QPDFWriter w;
  allocator<char> local_711;
  string local_710 [39];
  allocator<char> local_6e9;
  string local_6e8 [39];
  allocator<char> local_6c1;
  string local_6c0 [32];
  undefined1 local_6a0 [8];
  QPDFObjectHandle trailer;
  string local_688;
  QPDFObjectHandle local_668;
  allocator<char> local_651;
  string local_650;
  QPDFObjectHandle local_630;
  allocator<char> local_619;
  string local_618;
  QPDFObjectHandle local_5f8;
  undefined1 local_5e8 [8];
  QPDFObjectHandle r3;
  string local_5d0;
  QPDFObjectHandle local_5b0;
  anon_class_8_1_e5d0d581 local_5a0;
  anon_class_8_1_e5d0d581 show_conflicts;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  conflicts;
  string local_560 [32];
  QPDFObjectHandle local_540;
  allocator<char> local_529;
  string local_528 [39];
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410 [32];
  QPDFObjectHandle local_3f0;
  allocator<char> local_3d9;
  string local_3d8 [32];
  QPDFObjectHandle local_3b8;
  allocator<char> local_3a1;
  string local_3a0 [39];
  allocator<char> local_379;
  string local_378 [32];
  undefined1 local_358 [8];
  QPDFObjectHandle r2;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200 [32];
  undefined1 local_1e0 [8];
  QPDFObjectHandle y;
  allocator<char> local_1b9;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [32];
  undefined1 local_170 [8];
  QPDFObjectHandle z;
  anon_class_8_1_ba1d6c52 make_resource;
  string local_150 [32];
  QPDFObjectHandle local_130;
  allocator<char> local_119;
  string local_118 [32];
  QPDFObjectHandle local_f8;
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [32];
  QPDFObjectHandle local_98 [2];
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [8];
  string name;
  int i;
  int min_suffix;
  QPDFObjectHandle r1;
  char *arg2_local;
  QPDF *pdf_local;
  
  r1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDFObjectHandle::newDictionary();
  name.field_2._12_4_ = 1;
  for (name.field_2._8_4_ = 1; (int)name.field_2._8_4_ < 3;
      name.field_2._8_4_ = name.field_2._8_4_ + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"/Quack",&local_71);
    QPDFObjectHandle::getUniqueResourceName(local_50,&i,(set *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b8,"<< /Z << >> >>",&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"",&local_e1);
    QPDFObjectHandle::parse((string *)local_98,local_b8);
    QPDFObjectHandle::mergeResources((QPDFObjectHandle *)&i,(map *)local_98);
    QPDFObjectHandle::~QPDFObjectHandle(local_98);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_118,"/Z",&local_119);
    QPDFObjectHandle::getKey((string *)&local_f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_150,"moo",(allocator<char> *)((long)&make_resource.pdf + 7));
    QPDFObjectHandle::newString((string *)&local_130);
    QPDFObjectHandle::replaceKey((string *)&local_f8,(QPDFObjectHandle *)local_50);
    QPDFObjectHandle::~QPDFObjectHandle(&local_130);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)((long)&make_resource.pdf + 7));
    QPDFObjectHandle::~QPDFObjectHandle(&local_f8);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string(local_50);
  }
  z.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"/Z",&local_191);
  QPDFObjectHandle::getKey((string *)local_170);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"/Y",&local_1b9);
  QPDFObjectHandle::newDictionary();
  QPDFObjectHandle::replaceKey((string *)&i,(QPDFObjectHandle *)local_1b8);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &y.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"/Y",&local_201);
  QPDFObjectHandle::getKey((string *)local_1e0);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"/F1",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"r1.Z.F1",&local_251);
  test_60::anon_class_8_1_ba1d6c52::operator()
            ((anon_class_8_1_ba1d6c52 *)
             &z.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPDFObjectHandle *)local_170,&local_228,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"/F2",&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"r1.Z.F2",&local_2a1);
  test_60::anon_class_8_1_ba1d6c52::operator()
            ((anon_class_8_1_ba1d6c52 *)
             &z.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPDFObjectHandle *)local_170,&local_278,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"/F2",&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"r1.Y.F2",&local_2f1);
  test_60::anon_class_8_1_ba1d6c52::operator()
            ((anon_class_8_1_ba1d6c52 *)
             &z.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPDFObjectHandle *)local_1e0,&local_2c8,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"/F3",&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"r1.Y.F3",
             (allocator<char> *)
             ((long)&r2.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  test_60::anon_class_8_1_ba1d6c52::operator()
            ((anon_class_8_1_ba1d6c52 *)
             &z.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPDFObjectHandle *)local_1e0,&local_318,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&r2.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_378,"<< /Z << >> /Y << >> >>",&local_379)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"",&local_3a1);
  QPDFObjectHandle::parse((string *)local_358,local_378);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3d8,"/Z",&local_3d9);
  QPDFObjectHandle::getKey((string *)&local_3b8);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_170,&local_3b8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_3b8);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_410,"/Y",&local_411);
  QPDFObjectHandle::getKey((string *)&local_3f0);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_1e0,&local_3f0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_3f0);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator(&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"/F2",&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"r2.Z.F2",&local_461);
  test_60::anon_class_8_1_ba1d6c52::operator()
            ((anon_class_8_1_ba1d6c52 *)
             &z.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPDFObjectHandle *)local_170,&local_438,&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"/F3",&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"r2.Y.F3",&local_4b1);
  test_60::anon_class_8_1_ba1d6c52::operator()
            ((anon_class_8_1_ba1d6c52 *)
             &z.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPDFObjectHandle *)local_1e0,&local_488,&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"/F4",&local_4d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"r2.Y.F4",&local_501);
  test_60::anon_class_8_1_ba1d6c52::operator()
            ((anon_class_8_1_ba1d6c52 *)
             &z.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPDFObjectHandle *)local_1e0,&local_4d8,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_528,"/F5",&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_560,"direct r2.Y.F5",
             (allocator<char> *)
             ((long)&conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  QPDFObjectHandle::newString((string *)&local_540);
  QPDFObjectHandle::replaceKey((string *)local_1e0,(QPDFObjectHandle *)local_528);
  QPDFObjectHandle::~QPDFObjectHandle(&local_540);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator(&local_529);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
         *)&show_conflicts);
  local_5a0.conflicts =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        *)&show_conflicts;
  QPDFObjectHandle::QPDFObjectHandle(&local_5b0,(QPDFObjectHandle *)local_358);
  QPDFObjectHandle::mergeResources((QPDFObjectHandle *)&i,(map *)&local_5b0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_5b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"first merge",
             (allocator<char> *)
             ((long)&r3.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  test_60::anon_class_8_1_e5d0d581::operator()(&local_5a0,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&r3.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::shallowCopy();
  QPDFObjectHandle::QPDFObjectHandle(&local_5f8,(QPDFObjectHandle *)local_358);
  QPDFObjectHandle::mergeResources((QPDFObjectHandle *)&i,(map *)&local_5f8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"second merge",&local_619)
  ;
  test_60::anon_class_8_1_e5d0d581::operator()(&local_5a0,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  QPDFObjectHandle::makeResourcesIndirect((QPDF *)local_358);
  QPDFObjectHandle::QPDFObjectHandle(&local_630,(QPDFObjectHandle *)local_358);
  QPDFObjectHandle::mergeResources((QPDFObjectHandle *)&i,(map *)&local_630);
  QPDFObjectHandle::~QPDFObjectHandle(&local_630);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,"third merge",&local_651);
  test_60::anon_class_8_1_e5d0d581::operator()(&local_5a0,&local_650);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator(&local_651);
  QPDFObjectHandle::QPDFObjectHandle(&local_668,(QPDFObjectHandle *)local_358);
  QPDFObjectHandle::mergeResources((QPDFObjectHandle *)&i,(map *)&local_668);
  QPDFObjectHandle::~QPDFObjectHandle(&local_668);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_688,"fourth merge",
             (allocator<char> *)
             ((long)&trailer.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  test_60::anon_class_8_1_e5d0d581::operator()(&local_5a0,&local_688);
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&trailer.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"/QTest1",&local_6c1);
  QPDFObjectHandle::replaceKey((string *)local_6a0,(QPDFObjectHandle *)local_6c0);
  std::__cxx11::string::~string(local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6e8,"/QTest2",&local_6e9);
  QPDFObjectHandle::replaceKey((string *)local_6a0,(QPDFObjectHandle *)local_6e8);
  std::__cxx11::string::~string(local_6e8);
  std::allocator<char>::~allocator(&local_6e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_710,"/QTest3",&local_711);
  QPDFObjectHandle::replaceKey((string *)local_6a0,(QPDFObjectHandle *)local_710);
  std::__cxx11::string::~string(local_710);
  std::allocator<char>::~allocator(&local_711);
  QPDFWriter::QPDFWriter(local_728,pdf,"a.pdf");
  QPDFWriter::setQDFMode(SUB81(local_728,0));
  QPDFWriter::setStaticID(SUB81(local_728,0));
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_728);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_6a0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_5e8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          *)&show_conflicts);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_358);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1e0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_170);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&i);
  return;
}

Assistant:

static void
test_60(QPDF& pdf, char const* arg2)
{
    // Boundary condition testing for getUniqueResourceName;
    // additional testing of mergeResources with conflict
    // detection
    QPDFObjectHandle r1 = QPDFObjectHandle::newDictionary();
    int min_suffix = 1;
    for (int i = 1; i < 3; ++i) {
        std::string name = r1.getUniqueResourceName("/Quack", min_suffix);
        r1.mergeResources(QPDFObjectHandle::parse("<< /Z << >> >>"));
        r1.getKey("/Z").replaceKey(name, QPDFObjectHandle::newString("moo"));
    }
    auto make_resource =
        [&](QPDFObjectHandle& dict, std::string const& key, std::string const& str) {
            auto o1 = QPDFObjectHandle::newArray();
            o1.appendItem(QPDFObjectHandle::newString(str));
            dict.replaceKey(key, pdf.makeIndirectObject(o1));
        };

    auto z = r1.getKey("/Z");
    r1.replaceKey("/Y", QPDFObjectHandle::newDictionary());
    auto y = r1.getKey("/Y");
    make_resource(z, "/F1", "r1.Z.F1");
    make_resource(z, "/F2", "r1.Z.F2");
    make_resource(y, "/F2", "r1.Y.F2");
    make_resource(y, "/F3", "r1.Y.F3");
    QPDFObjectHandle r2 = QPDFObjectHandle::parse("<< /Z << >> /Y << >> >>");
    z = r2.getKey("/Z");
    y = r2.getKey("/Y");
    make_resource(z, "/F2", "r2.Z.F2");
    make_resource(y, "/F3", "r2.Y.F3");
    make_resource(y, "/F4", "r2.Y.F4");
    // Add a direct object
    y.replaceKey("/F5", QPDFObjectHandle::newString("direct r2.Y.F5"));

    std::map<std::string, std::map<std::string, std::string>> conflicts;
    auto show_conflicts = [&](std::string const& msg) {
        std::cout << msg << std::endl;
        for (auto const& i1: conflicts) {
            std::cout << i1.first << ":" << std::endl;
            for (auto const& i2: i1.second) {
                std::cout << "  " << i2.first << " -> " << i2.second << std::endl;
            }
        }
    };

    r1.mergeResources(r2, &conflicts);
    show_conflicts("first merge");
    auto r3 = r1.shallowCopy();
    // Merge again. The direct object gets recopied. Everything
    // else is the same.
    r1.mergeResources(r2, &conflicts);
    show_conflicts("second merge");

    // Make all resources in r2 direct. Then merge two more times.
    // We should get the one previously direct object copied one
    // time as an indirect object.
    r2.makeResourcesIndirect(pdf);
    r1.mergeResources(r2, &conflicts);
    show_conflicts("third merge");
    r1.mergeResources(r2, &conflicts);
    show_conflicts("fourth merge");

    // The only differences between /QTest and /QTest3 should be
    // the direct objects merged from r2.
    auto trailer = pdf.getTrailer();
    trailer.replaceKey("/QTest1", r1);
    trailer.replaceKey("/QTest2", r2);
    trailer.replaceKey("/QTest3", r3);
    QPDFWriter w(pdf, "a.pdf");
    w.setQDFMode(true);
    w.setStaticID(true);
    w.write();
}